

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

float pbrt::FastExp(float x)

{
  int iVar1;
  float in_XMM0_Da;
  double dVar2;
  uint32_t bits;
  int exponent;
  float twoToF;
  int i;
  float f;
  float fxp;
  float xp;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  dVar2 = pstd::floor((double)(ulong)(uint)(in_XMM0_Da * 1.442695));
  EvaluatePolynomial<float,float,float,float,float>
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8,0.0);
  iVar1 = Exponent(0.0);
  iVar1 = iVar1 + (int)SUB84(dVar2,0);
  if (iVar1 < -0x7e) {
    local_4 = 0.0;
  }
  else if (iVar1 < 0x80) {
    FloatToBits(0.0);
    local_4 = BitsToFloat(0);
  }
  else {
    local_4 = INFINITY;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU inline float FastExp(float x) {
#ifdef PBRT_IS_GPU_CODE
    return __expf(x);
#else
    // Compute $x'$ such that $\roman{e}^x = 2^{x'}$
    float xp = x * 1.442695041f;

    // Find integer and fractional components of $x'$
    float fxp = pstd::floor(xp), f = xp - fxp;
    int i = (int)fxp;

    // Evaluate polynomial approximation of $2^f$
    float twoToF = EvaluatePolynomial(f, 1.f, 0.695556856f, 0.226173572f, 0.0781455737f);

    // Scale $2^f$ by $2^i$ and return final result
    int exponent = Exponent(twoToF) + i;
    if (exponent < -126)
        return 0;
    if (exponent > 127)
        return Infinity;
    uint32_t bits = FloatToBits(twoToF);
    bits &= 0b10000000011111111111111111111111u;
    bits |= (exponent + 127) << 23;
    return BitsToFloat(bits);
#endif
}